

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

void __thiscall
soplex::SPxBoundFlippingRT<double>::collectBreakpointsMax
          (SPxBoundFlippingRT<double> *this,int *nBp,int *minIdx,int *idx,int nnz,double *upd,
          double *vec,double *upp,double *low,BreakpointSource src)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer pBVar5;
  long *in_FS_OFFSET;
  ulong uVar6;
  double dVar7;
  double local_80;
  
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    pBVar5 = (pointer)(*in_FS_OFFSET + -8);
  }
  else {
    pBVar5 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start + *minIdx;
  }
  if (0 < nnz) {
    piVar1 = idx + nnz;
    local_80 = pBVar5->val;
    dVar2 = (double)in_FS_OFFSET[-1];
    do {
      iVar4 = *idx;
      dVar3 = upd[iVar4];
      dVar7 = (this->super_SPxFastRT<double>).epsilon;
      if (dVar3 <= dVar7) {
        if (dVar3 < -dVar7) {
          dVar7 = low[iVar4];
          ::soplex::infinity::__tls_init();
          if (-dVar2 < dVar7) {
            dVar7 = (this->super_SPxFastRT<double>).fastDelta;
            uVar6 = -(ulong)(low[iVar4] - vec[iVar4] < 0.0);
            dVar7 = (double)(~uVar6 & (ulong)-dVar7 |
                            (ulong)((low[iVar4] - vec[iVar4]) - dVar7) & uVar6);
            goto LAB_002183d5;
          }
        }
      }
      else {
        dVar7 = upp[iVar4];
        ::soplex::infinity::__tls_init();
        if (dVar7 < dVar2) {
          dVar7 = (this->super_SPxFastRT<double>).fastDelta;
          uVar6 = -(ulong)(0.0 < upp[iVar4] - vec[iVar4]);
          dVar7 = (double)(~uVar6 & (ulong)dVar7 |
                          (ulong)((upp[iVar4] - vec[iVar4]) + dVar7) & uVar6);
LAB_002183d5:
          dVar7 = dVar7 / dVar3;
          pBVar5 = (this->breakpoints).data.
                   super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pBVar5[*nBp].idx = iVar4;
          iVar4 = *nBp;
          pBVar5[iVar4].src = src;
          pBVar5[iVar4].val = dVar7;
          if (dVar7 < local_80) {
            *minIdx = iVar4;
            local_80 = dVar7;
          }
          *nBp = *nBp + 1;
        }
      }
      if ((int)((ulong)((long)(this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->breakpoints).data.
                             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) <= *nBp) {
        std::
        vector<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
        ::resize(&(this->breakpoints).data,(long)*nBp * 2);
      }
      idx = idx + 1;
    } while (idx < piVar1);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMax(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? this->fastDelta / x : (y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];
            curVal = (y >= 0) ? -this->fastDelta / x : (y - this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}